

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mode5InterrogatorBasicData.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::Mode5InterrogatorBasicData::Encode
          (Mode5InterrogatorBasicData *this,KDataStream *stream)

{
  KDataStream *pKVar1;
  KDataStream *stream_local;
  Mode5InterrogatorBasicData *this_local;
  
  pKVar1 = DATA_TYPE::operator<<(stream,&(this->m_Status).super_DataTypeBase);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui8Padding);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui16Padding1);
  pKVar1 = KDataStream::operator<<(pKVar1,this->m_ui32MsgFormats);
  pKVar1 = DATA_TYPE::operator<<(pKVar1,(DataTypeBase *)&this->m_InterrogatedID);
  KDataStream::operator<<(pKVar1,this->m_ui16Padding2);
  return;
}

Assistant:

void Mode5InterrogatorBasicData::Encode( KDataStream & stream ) const
{
	stream << KDIS_STREAM m_Status
		   << m_ui8Padding
		   << m_ui16Padding1
		   << m_ui32MsgFormats
		   << KDIS_STREAM m_InterrogatedID
		   << m_ui16Padding2;
}